

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Off_reader.h
# Opt level: O2

bool __thiscall
Gudhi::Off_reader::
read<Gudhi::skeleton_blocker::Skeleton_blocker_off_flag_visitor_reader<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>>>
          (Off_reader *this,
          Skeleton_blocker_off_flag_visitor_reader<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
          *off_visitor)

{
  bool bVar1;
  char *pcVar2;
  
  bVar1 = read_off_preamble<Gudhi::skeleton_blocker::Skeleton_blocker_off_flag_visitor_reader<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>>>
                    (this,off_visitor);
  if (bVar1) {
    bVar1 = read_off_points<Gudhi::skeleton_blocker::Skeleton_blocker_off_flag_visitor_reader<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>>>
                      (this,off_visitor);
    if (bVar1) {
      bVar1 = read_off_faces<Gudhi::skeleton_blocker::Skeleton_blocker_off_flag_visitor_reader<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>>>
                        (this,off_visitor);
      if (bVar1) {
        return true;
      }
      pcVar2 = "could not read off faces\n";
    }
    else {
      pcVar2 = "could not read off points\n";
    }
  }
  else {
    pcVar2 = "could not read off preambule\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar2);
  return false;
}

Assistant:

bool read(OffVisitor& off_visitor) {
    bool success_read_off_preamble = read_off_preamble(off_visitor);
    if (!success_read_off_preamble) {
      std::cerr << "could not read off preambule\n";
      return false;
    }

    bool success_read_off_points = read_off_points(off_visitor);
    if (!success_read_off_points) {
      std::cerr << "could not read off points\n";
      return false;
    }

    bool success_read_off_faces = read_off_faces(off_visitor);
    if (!success_read_off_faces) {
      std::cerr << "could not read off faces\n";
      return false;
    }

    off_visitor.done();
    return success_read_off_preamble && success_read_off_points && success_read_off_faces;
  }